

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O2

filtration_algorithm_t * get_filtration_computer(string *algorithm)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  filtration_algorithm_t *pfVar5;
  invalid_argument *this;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string err_msg;
  string local_40;
  
  pcVar1 = (algorithm->_M_dataplus)._M_p;
  sVar2 = algorithm->_M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = tolower((int)pcVar1[sVar6]);
    pcVar1[sVar6] = (char)iVar4;
  }
  bVar3 = std::operator==(algorithm,"zero");
  if ((!bVar3) && (bVar3 = std::operator==(algorithm,""), !bVar3)) {
    std::__cxx11::string::string((string *)&local_40,(string *)algorithm);
    pfVar5 = get_custom_filtration_computer(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (pfVar5 != (filtration_algorithm_t *)0x0) {
      return pfVar5;
    }
    std::operator+(&local_80,"The filtration algorithm \"",algorithm);
    std::operator+(&err_msg,&local_80,"\" could not be found.");
    std::__cxx11::string::~string((string *)&local_80);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,(string *)&err_msg);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return (filtration_algorithm_t *)0x0;
}

Assistant:

filtration_algorithm_t* get_filtration_computer(std::string algorithm) {
	std::transform(algorithm.begin(), algorithm.end(), algorithm.begin(), ::tolower);

	// For the trivial filtration, skip the computation of filtration values altogether
	if (algorithm == "zero" || algorithm == "") return nullptr;

	filtration_algorithm_t* custom = get_custom_filtration_computer(algorithm);

	if (custom != nullptr) return custom;

	std::string err_msg = "The filtration algorithm \"" + algorithm + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}